

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

void __thiscall
ear::GainCalculatorDirectSpeakersImpl::calculate
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          OutputGains *direct,WarningCB *warning_cb)

{
  WarningCB *pWVar1;
  OutputGains *this_00;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  adm_error *this_01;
  reference_const_type __x;
  pointer ppVar5;
  const_reference label_00;
  reference rule_00;
  reference pbVar6;
  Scalar *pSVar7;
  reference_type piVar8;
  iterator iVar9;
  difference_type dVar10;
  element_type *peVar11;
  reference_type other;
  BooleanNotReturnType local_3f0;
  Matrix<double,_3,_1,_0,_3,_1> local_3e0;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3c8;
  undefined1 local_3b0 [8];
  VectorXd gains;
  undefined1 local_2d0 [8];
  Vector3d pos;
  iterator iStack_2a0;
  int index_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_1;
  optional<int> index;
  SpeakerPosition shiftedPosition;
  iterator iStack_190;
  int index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  string nominalLabel;
  string speakerLabel;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  type local_110;
  optional<int> idx;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *channel_gain;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range5;
  MappingRule *rule;
  const_iterator __end3;
  const_iterator __begin3;
  vector<ear::MappingRule,_std::allocator<ear::MappingRule>_> *__range3;
  string label;
  string *itu_layout_name;
  _Self local_98;
  const_iterator found_pack;
  bool isLfe;
  double tol;
  allocator<char> local_69;
  string local_68;
  WarningCB *local_48;
  WarningCB *warning_cb_local;
  OutputGains *direct_local;
  DirectSpeakersTypeMetadata *metadata_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  type *local_10;
  
  local_20 = &metadata->audioPackFormatID;
  local_48 = warning_cb;
  warning_cb_local = (WarningCB *)direct;
  direct_local = (OutputGains *)metadata;
  metadata_local = (DirectSpeakersTypeMetadata *)this;
  bVar2 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(local_20);
  if ((((bVar2 ^ 0xffU) & 1) != 0) &&
     (sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)direct_local), sVar4 == 0)) {
    tol._3_1_ = 1;
    this_01 = (adm_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "common definitions audioPackFormatID specified without any speakerLabels as specified in the common definitions file"
               ,&local_69);
    adm_error::adm_error(this_01,&local_68);
    tol._3_1_ = 0;
    __cxa_throw(this_01,&adm_error::typeinfo,adm_error::~adm_error);
  }
  (*(code *)**(undefined8 **)&(warning_cb_local->super__Function_base)._M_functor)
            (warning_cb_local,(long)this->_nChannels);
  boost::
  apply_visitor<ear::(anonymous_namespace)::throw_if_not_implemented,boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&>
            ((throw_if_not_implemented *)((long)&tol + 2),
             (variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)(direct_local + 3)
            );
  found_pack._M_node._7_1_ = _isLfeChannel(this,(DirectSpeakersTypeMetadata *)direct_local,local_48)
  ;
  (**(code **)(*(long *)&(warning_cb_local->super__Function_base)._M_functor + 0x18))();
  this_local = (GainCalculatorDirectSpeakersImpl *)(direct_local + 0x21);
  bVar2 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_local);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    __x = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(direct_local + 0x21));
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)itu_packs_abi_cxx11_,__x);
    itu_layout_name =
         (string *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)itu_packs_abi_cxx11_);
    bVar2 = std::operator!=(&local_98,(_Self *)&itu_layout_name);
    if (bVar2) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_98);
      label.field_2._8_8_ = &ppVar5->second;
      label_00 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)direct_local,0);
      _nominalSpeakerLabel((string *)&__range3,this,label_00);
      __end3 = std::vector<ear::MappingRule,_std::allocator<ear::MappingRule>_>::begin
                         ((vector<ear::MappingRule,_std::allocator<ear::MappingRule>_> *)rules);
      rule = (MappingRule *)
             std::vector<ear::MappingRule,_std::allocator<ear::MappingRule>_>::end
                       ((vector<ear::MappingRule,_std::allocator<ear::MappingRule>_> *)rules);
LAB_0022b0e3:
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_ear::MappingRule_*,_std::vector<ear::MappingRule,_std::allocator<ear::MappingRule>_>_>
                                  *)&rule);
      if (bVar2) {
        rule_00 = __gnu_cxx::
                  __normal_iterator<const_ear::MappingRule_*,_std::vector<ear::MappingRule,_std::allocator<ear::MappingRule>_>_>
                  ::operator*(&__end3);
        bVar2 = anon_unknown_21::rule_applies
                          (rule_00,(string *)label.field_2._8_8_,(string *)&__range3,&this->_layout)
        ;
        if (!bVar2) goto LAB_0022b288;
        __end5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::begin(&rule_00->gains);
        channel_gain = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                        *)std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          ::end(&rule_00->gains);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                                           *)&channel_gain), bVar2) {
          idx.super_type =
               (type)__gnu_cxx::
                     __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
                     ::operator*(&__end5);
          local_110 = (type)Layout::indexForName(&this->_layout,(string *)idx.super_type);
          local_10 = &local_110;
          bVar2 = boost::optional<int>::operator!((optional<int> *)local_10);
          _assert_impl(!bVar2,"mapping channel not found");
          pWVar1 = warning_cb_local;
          piVar8 = boost::optional<int>::get((optional<int> *)&local_110);
          (**(code **)(*(long *)&(pWVar1->super__Function_base)._M_functor + 0x10))
                    (*(undefined8 *)((long)idx.super_type + 0x20),pWVar1,(long)*piVar8);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
          ::operator++(&__end5);
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&__range3);
      if (bVar2) {
        return;
      }
    }
  }
  this_00 = direct_local;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)direct_local);
  speakerLabel.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&speakerLabel.field_2 + 8));
    if (!bVar2) {
      _applyScreenEdgeLock((SpeakerPosition *)&index,this,(SpeakerPosition *)(direct_local + 3));
      it_1._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           _findChannelWithinBounds
                     (this,(SpeakerPosition *)&index,(bool)(found_pack._M_node._7_1_ & 1),1e-05);
      local_18 = &it_1;
      bVar2 = boost::optional<int>::operator!((optional<int> *)local_18);
      pWVar1 = warning_cb_local;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if ((found_pack._M_node._7_1_ & 1) == 0) {
          boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::variant
                    ((variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)
                     &gains.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows,(variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)
                              &index);
          toCartesianVector3d((Vector3d *)local_2d0,
                              (SpeakerPosition *)
                              &gains.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows);
          boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::~variant
                    ((variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)
                     &gains.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows);
          peVar11 = std::
                    __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->_pointSourcePanner);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    (&local_3e0,(Matrix<double,_3,_1,_0,_3,_1> *)local_2d0);
          (**peVar11->_vptr_PointSourcePanner)(&local_3c8,peVar11,&local_3e0);
          other = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get(&local_3c8);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0,other);
          boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional(&local_3c8);
          pWVar1 = warning_cb_local;
          Eigen::ArrayBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>::operator!
                    (&local_3f0,(ArrayBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_> *)&this->_isLfe);
          mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((OutputGains *)pWVar1,&local_3f0,(Matrix<double,__1,_1,_0,__1,_1> *)local_3b0);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0);
        }
        else {
          local_290._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->_channelNames);
          local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&this->_channelNames);
          local_288 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[5]>
                                (local_290,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_298,(char (*) [5])"LFE1");
          iStack_2a0 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&this->_channelNames);
          bVar2 = __gnu_cxx::operator!=(&local_288,&stack0xfffffffffffffd60);
          if (bVar2) {
            iVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&this->_channelNames);
            pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [2] = (double)local_288._M_current;
            dVar10 = std::
                     distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )iVar9._M_current,local_288);
            (**(code **)(*(long *)&(warning_cb_local->super__Function_base)._M_functor + 0x10))
                      (0x3ff0000000000000,warning_cb_local,(long)(int)dVar10);
          }
        }
      }
      else {
        piVar8 = boost::get<int>((optional<int> *)&it_1);
        (**(code **)(*(long *)&(pWVar1->super__Function_base)._M_functor + 0x10))
                  (0x3ff0000000000000,pWVar1,(long)*piVar8);
      }
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::~variant
                ((variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)&index);
      return;
    }
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)(nominalLabel.field_2._M_local_buf + 8),(string *)pbVar6)
    ;
    _nominalSpeakerLabel((string *)&it,this,(string *)(nominalLabel.field_2._M_local_buf + 8));
    local_180._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->_channelNames);
    local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->_channelNames);
    local_178 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (local_180,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it)
    ;
    iStack_190 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->_channelNames);
    bVar2 = __gnu_cxx::operator!=(&local_178,&stack0xfffffffffffffe70);
    if (bVar2) {
      iVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&this->_channelNames);
      dVar10 = std::
               distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )iVar9._M_current,local_178);
      bVar3 = found_pack._M_node._7_1_ & 1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                          (long)(int)dVar10);
      if (bVar3 != (*pSVar7 & 1U)) goto LAB_0022b4db;
      (**(code **)(*(long *)&(warning_cb_local->super__Function_base)._M_functor + 0x10))
                (0x3ff0000000000000,warning_cb_local,(long)(int)dVar10);
      bVar2 = true;
    }
    else {
LAB_0022b4db:
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&it);
    if (!bVar2) {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)(nominalLabel.field_2._M_local_buf + 8));
    if (bVar2) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
LAB_0022b288:
  __gnu_cxx::
  __normal_iterator<const_ear::MappingRule_*,_std::vector<ear::MappingRule,_std::allocator<ear::MappingRule>_>_>
  ::operator++(&__end3);
  goto LAB_0022b0e3;
}

Assistant:

void GainCalculatorDirectSpeakersImpl::calculate(
      const DirectSpeakersTypeMetadata& metadata, OutputGains& direct,
      const WarningCB& warning_cb) {
    if (metadata.audioPackFormatID && metadata.speakerLabels.size() == 0)
      throw adm_error(
          "common definitions audioPackFormatID specified without any "
          "speakerLabels as specified in the common definitions file");
    direct.check_size(_nChannels);

    boost::apply_visitor(throw_if_not_implemented(), metadata.position);

    double tol = 1e-5;
    bool isLfe = _isLfeChannel(metadata, warning_cb);
    direct.zero();

    if (metadata.audioPackFormatID) {
      auto found_pack = itu_packs.find(metadata.audioPackFormatID.get());
      if (found_pack != itu_packs.end()) {
        const std::string& itu_layout_name = found_pack->second;
        std::string label = _nominalSpeakerLabel(metadata.speakerLabels[0]);

        for (const MappingRule& rule : rules) {
          if (rule_applies(rule, itu_layout_name, label, _layout)) {
            for (auto& channel_gain : rule.gains) {
              auto idx = _layout.indexForName(channel_gain.first);
              ear_assert((bool)idx, "mapping channel not found");
              direct.write(idx.get(), channel_gain.second);
            }
            return;
          }
        }
      }
    }

    // try to find a speaker that matches a speakerLabel and type; earlier
    // speakerLabel values have higher priority
    for (std::string speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      auto it =
          std::find(_channelNames.begin(), _channelNames.end(), nominalLabel);
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        if (isLfe == _isLfe[index]) {
          direct.write(index, 1.0);
          return;
        }
      }
    }
    // shift the nominal speaker position to the screen edges if specified
    SpeakerPosition shiftedPosition = _applyScreenEdgeLock(metadata.position);

    // otherwise, find the closest speaker with the correct type within the
    // given bounds
    boost::optional<int> index =
        _findChannelWithinBounds(shiftedPosition, isLfe, tol);
    if (index) {
      direct.write(boost::get(index), 1.0);
      return;
    }

    // otherwise, use the point source panner for non-LFE, and handle LFE
    // channels using downmixing rules

    if (isLfe) {
      auto it = std::find(_channelNames.begin(), _channelNames.end(), "LFE1");
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        direct.write(index, 1.0);
      }
      return;
    } else {
      Eigen::Vector3d pos = toCartesianVector3d(shiftedPosition);
      Eigen::VectorXd gains = _pointSourcePanner->handle(pos).get();
      mask_write(direct, !_isLfe, gains);
      return;
    }
  }